

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

DataModelConstructor __thiscall
Rml::Context::CreateDataModel(Context *this,String *name,DataTypeRegister *data_type_register)

{
  bool bVar1;
  pointer ppVar2;
  pointer model;
  undefined8 uVar3;
  bool inserted;
  unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_> local_58;
  undefined1 local_50 [8];
  pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
  result;
  DataTypeRegister *data_type_register_local;
  String *name_local;
  Context *this_local;
  
  if (data_type_register == (DataTypeRegister *)0x0) {
    bVar1 = ::std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr *)&this->default_data_type_register);
    if (!bVar1) {
      MakeUnique<Rml::DataTypeRegister>();
      ::std::unique_ptr<Rml::DataTypeRegister,_std::default_delete<Rml::DataTypeRegister>_>::
      operator=(&this->default_data_type_register,
                (unique_ptr<Rml::DataTypeRegister,_std::default_delete<Rml::DataTypeRegister>_> *)
                &result.second);
      ::std::unique_ptr<Rml::DataTypeRegister,_std::default_delete<Rml::DataTypeRegister>_>::
      ~unique_ptr((unique_ptr<Rml::DataTypeRegister,_std::default_delete<Rml::DataTypeRegister>_> *)
                  &result.second);
    }
    ::std::unique_ptr<Rml::DataTypeRegister,_std::default_delete<Rml::DataTypeRegister>_>::get
              (&this->default_data_type_register);
  }
  MakeUnique<Rml::DataModel,Rml::DataTypeRegister*&>((DataTypeRegister **)&local_58);
  robin_hood::detail::
  Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::DataModel,std::default_delete<Rml::DataModel>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
  ::
  emplace<std::__cxx11::string_const&,std::unique_ptr<Rml::DataModel,std::default_delete<Rml::DataModel>>>
            ((pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
              *)local_50,
             (Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::DataModel,std::default_delete<Rml::DataModel>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
              *)&this->data_models,name,&local_58);
  ::std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>::~unique_ptr(&local_58);
  if (((byte)result.first.mInfo & 1) == 0) {
    uVar3 = ::std::__cxx11::string::c_str();
    Log::Message(LT_ERROR,"Data model name \'%s\' already exists.",uVar3);
    DataModelConstructor::DataModelConstructor((DataModelConstructor *)&this_local);
  }
  else {
    ppVar2 = robin_hood::detail::
             Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::Iter<false>::operator->((Iter<false> *)local_50);
    model = ::std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>::get
                      (&ppVar2->second);
    DataModelConstructor::DataModelConstructor((DataModelConstructor *)&this_local,model);
  }
  return _this_local;
}

Assistant:

DataModelConstructor Context::CreateDataModel(const String& name, DataTypeRegister* data_type_register)
{
	if (!data_type_register)
	{
		if (!default_data_type_register)
			default_data_type_register = MakeUnique<DataTypeRegister>();
		data_type_register = default_data_type_register.get();
	}

	auto result = data_models.emplace(name, MakeUnique<DataModel>(data_type_register));
	bool inserted = result.second;
	if (inserted)
		return DataModelConstructor(result.first->second.get());

	Log::Message(Log::LT_ERROR, "Data model name '%s' already exists.", name.c_str());
	return DataModelConstructor();
}